

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void function(FunctionType type)

{
  _Bool _Var1;
  ObjFunction *pOVar2;
  int i;
  ObjFunction *function;
  uint8_t paramConstant;
  Compiler compiler;
  undefined4 in_stack_ffffffffffffddb8;
  FunctionType in_stack_ffffffffffffddbc;
  undefined4 in_stack_ffffffffffffddc0;
  TokenType in_stack_ffffffffffffddc4;
  int iVar3;
  
  initCompiler((Compiler *)CONCAT44(in_stack_ffffffffffffddc4,in_stack_ffffffffffffddc0),
               in_stack_ffffffffffffddbc);
  beginScope();
  consume(in_stack_ffffffffffffddc4,
          (char *)CONCAT44(in_stack_ffffffffffffddbc,in_stack_ffffffffffffddb8));
  _Var1 = check(TOKEN_RIGHT_PAREN);
  if (!_Var1) {
    do {
      current->function->arity = current->function->arity + 1;
      if (0xff < current->function->arity) {
        errorAtCurrent((char *)0x1076e6);
      }
      parseVariable((char *)CONCAT44(in_stack_ffffffffffffddbc,in_stack_ffffffffffffddb8));
      defineVariable('\0');
      _Var1 = match(0x10770a);
    } while (_Var1);
  }
  consume(in_stack_ffffffffffffddc4,
          (char *)CONCAT44(in_stack_ffffffffffffddbc,in_stack_ffffffffffffddb8));
  consume(in_stack_ffffffffffffddc4,
          (char *)CONCAT44(in_stack_ffffffffffffddbc,in_stack_ffffffffffffddb8));
  block();
  pOVar2 = endCompiler();
  makeConstant(CONCAT44(in_stack_ffffffffffffddbc,in_stack_ffffffffffffddb8));
  emitBytes('\0','\0');
  for (iVar3 = 0; iVar3 < pOVar2->upvalueCount; iVar3 = iVar3 + 1) {
    emitByte('\0');
    emitByte('\0');
  }
  return;
}

Assistant:

static void function(FunctionType type) {
    Compiler compiler;
    initCompiler(&compiler, type);
    beginScope();

    // Compile the parameter list.
    consume(TOKEN_LEFT_PAREN, "Expect '(' after function name.");

    //Parameter
    if (!check(TOKEN_RIGHT_PAREN)) {
        do {
            current->function->arity++;
            if (current->function->arity > PARAMS_MAX) {
                errorAtCurrent("Cannot have more than 255 parameters.");
            }

            uint8_t paramConstant = parseVariable("Expect parameter name.");
            defineVariable(paramConstant);
        } while (match(TOKEN_COMMA));
    }

    consume(TOKEN_RIGHT_PAREN, "Expect ')' after parameters.");

    // The body.
    consume(TOKEN_LEFT_BRACE, "Expect '{' before function body.");
    block();

    // Create the function object.
    ObjFunction* function = endCompiler();
    emitBytes(OP_CLOSURE, makeConstant(OBJ_VAL(function)));

    /*
     * if the first byte is one, it captures a local variable in the enclosing function.
     * If zero, it captures one of the function’s UpValues
     */
    for (int i = 0; i < function->upvalueCount; i++) {
        emitByte(compiler.upvalues[i].isLocal ? 1 : 0);
        emitByte(compiler.upvalues[i].index);
    }
}